

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

int active_con_scale(void)

{
  int iVar1;
  
  if (0 < con_scale.Value) {
    return con_scale.Value;
  }
  iVar1 = 2;
  if (2 < CleanXfac) {
    iVar1 = CleanXfac;
  }
  return iVar1 + -1;
}

Assistant:

inline operator int () const { return Value; }